

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluDefs.cpp
# Opt level: O2

void __thiscall eglu::Error::Error(Error *this,deUint32 errCode,char *errStr)

{
  char *pcVar1;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"EGL returned ",&local_59);
  pcVar1 = getErrorName(errCode);
  std::operator+(&local_38,&local_58,pcVar1);
  pcVar1 = "";
  if (errStr != (char *)0x0) {
    pcVar1 = errStr;
  }
  tcu::TestError::TestError
            (&this->super_TestError,local_38._M_dataplus._M_p,pcVar1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluDefs.cpp"
             ,0x38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  *(undefined ***)&(this->super_TestError).super_TestException.super_Exception =
       &PTR__Exception_00711ea0;
  *(deUint32 *)&(this->super_TestError).super_TestException.field_0x34 = errCode;
  return;
}

Assistant:

Error::Error (deUint32 errCode, const char* errStr)
	: tcu::TestError	((std::string("EGL returned ") + getErrorName(errCode)).c_str(), errStr ? errStr : "", __FILE__, __LINE__)
	, m_error			(errCode)
{
}